

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitSIMDLoadZero
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,SIMDLoad *curr)

{
  Name memory;
  Type this_00;
  Index bytes;
  Address AVar1;
  Literal *pLVar2;
  undefined1 local_160 [8];
  Flow flow;
  Literal local_100;
  Literal local_e8;
  Literal local_d0;
  Literal local_b8;
  Literal local_a0;
  Literal local_88;
  undefined1 local_70 [8];
  Literal val;
  Literal zero;
  MemoryInstanceInfo info;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_160,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->ptr);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    getMemoryInstanceInfo
              ((MemoryInstanceInfo *)&zero.type,this,(Name)(curr->memory).super_IString.str);
    memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
    memory.super_IString.str._M_len = (size_t)info.instance;
    AVar1 = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)zero.type.id,memory);
    this_00 = zero.type;
    pLVar2 = Flow::getSingleValue((Flow *)local_160);
    ::wasm::Literal::Literal(&local_b8,pLVar2);
    bytes = ::wasm::SIMDLoad::getMemBytes();
    AVar1 = getFinalAddress<wasm::SIMDLoad>
                      ((ModuleRunnerBase<wasm::ModuleRunner> *)this_00.id,curr,&local_b8,bytes,AVar1
                      );
    ::wasm::Literal::~Literal(&local_b8);
    ::wasm::Literal::makeZero((Type)&val.type);
    if (curr->op == Load32ZeroVec128) {
      local_70._0_4_ =
           (**(code **)(**(long **)(zero.type.id + 0x288) + 0x90))
                     (*(long **)(zero.type.id + 0x288),AVar1.addr,info.instance,
                      info.name.super_IString.str._M_len);
      val.field_0.func.super_IString.str._M_str = (char *)0x2;
      ::wasm::Literal::Literal
                ((Literal *)&flow.breakTo.super_IString.str._M_str,(Literal *)local_70);
      ::wasm::Literal::Literal(&local_100,(Literal *)&val.type);
      ::wasm::Literal::Literal(&local_e8,(Literal *)&val.type);
      ::wasm::Literal::Literal(&local_d0,(Literal *)&val.type);
      ::wasm::Literal::Literal(&local_a0,(array *)&flow.breakTo.super_IString.str._M_str);
      Flow::Flow(__return_storage_ptr__,&local_a0);
      ::wasm::Literal::~Literal(&local_a0);
      std::array<wasm::Literal,_4UL>::~array
                ((array<wasm::Literal,_4UL> *)&flow.breakTo.super_IString.str._M_str);
    }
    else {
      local_70 = (undefined1  [8])
                 (**(code **)(**(long **)(zero.type.id + 0x288) + 0xa0))
                           (*(long **)(zero.type.id + 0x288),AVar1.addr,info.instance,
                            info.name.super_IString.str._M_len);
      val.field_0.func.super_IString.str._M_str = (char *)0x3;
      ::wasm::Literal::Literal
                ((Literal *)&flow.breakTo.super_IString.str._M_str,(Literal *)local_70);
      ::wasm::Literal::Literal(&local_100,(Literal *)&val.type);
      ::wasm::Literal::Literal(&local_88,(array *)&flow.breakTo.super_IString.str._M_str);
      Flow::Flow(__return_storage_ptr__,&local_88);
      ::wasm::Literal::~Literal(&local_88);
      std::array<wasm::Literal,_2UL>::~array
                ((array<wasm::Literal,_2UL> *)&flow.breakTo.super_IString.str._M_str);
    }
    ::wasm::Literal::~Literal((Literal *)local_70);
    ::wasm::Literal::~Literal((Literal *)&val.type);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_160);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_160);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDLoadZero(SIMDLoad* curr) {
    Flow flow = self()->visit(curr->ptr);
    if (flow.breaking()) {
      return flow;
    }
    NOTE_EVAL1(flow);
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    Address src = info.instance->getFinalAddress(
      curr, flow.getSingleValue(), curr->getMemBytes(), memorySize);
    auto zero =
      Literal::makeZero(curr->op == Load32ZeroVec128 ? Type::i32 : Type::i64);
    if (curr->op == Load32ZeroVec128) {
      auto val =
        Literal(info.instance->externalInterface->load32u(src, info.name));
      return Literal(std::array<Literal, 4>{{val, zero, zero, zero}});
    } else {
      auto val =
        Literal(info.instance->externalInterface->load64u(src, info.name));
      return Literal(std::array<Literal, 2>{{val, zero}});
    }
  }